

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MatchingTest_StreamReporterMatching_Test::
~MatchingTest_StreamReporterMatching_Test(MatchingTest_StreamReporterMatching_Test *this)

{
  MatchingTest_StreamReporterMatching_Test *this_local;
  
  ~MatchingTest_StreamReporterMatching_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(MatchingTest, StreamReporterMatching) {
  proto2_unittest::TestField msg1, msg2;
  msg1.set_c(72);
  msg2.set_c(72);
  msg1.add_rc(13);
  msg2.add_rc(13);
  msg1.add_rc(17);
  msg2.add_rc(17);
  std::string output;
  MessageDifferencer differencer;
  differencer.set_report_matches(true);
  differencer.ReportDifferencesToString(&output);
  EXPECT_TRUE(differencer.Compare(msg1, msg2));
  EXPECT_EQ(
      "matched: c : 72\n"
      "matched: rc[0] : 13\n"
      "matched: rc[1] : 17\n",
      output);
}